

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

uint64_t readStringLength(istream *stream)

{
  byte local_19;
  ulong uStack_18;
  uchar c;
  uint64_t value;
  istream *stream_local;
  
  uStack_18 = 0;
  value = (uint64_t)stream;
  do {
    std::istream::read((char *)value,(long)&local_19);
    uStack_18 = (long)(int)(local_19 & 0x7f) | uStack_18 << 7;
  } while ((local_19 & 0x80) != 0);
  return uStack_18;
}

Assistant:

std::uint64_t readStringLength(std::istream & stream)
{
  std::uint64_t value = 0;
  unsigned char c;
  do {
    stream.read(reinterpret_cast<char *>(&c), 1);
    value <<= 7;
    value |= (c & 0x7F);
  } while (c & 128);
  return value;
}